

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::LogDestination::WaitForSinks(LogMessageData *data)

{
  long lVar1;
  bool bVar2;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)sink_mutex_);
  if (sinks_ != (long *)0x0) {
    lVar1 = sinks_[1] - *sinks_ >> 3;
    while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
      (**(code **)(**(long **)(*sinks_ + lVar1 * 8) + 0x20))();
    }
  }
  if ((((code *)data->send_method_ == LogMessage::SendToSink ||
        (code *)data->send_method_ == LogMessage::SendToSinkAndLog) &&
      (*(long *)&data->field_0x76a8 == 0)) &&
     ((data->field_6).outvec_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0)) {
    (*(code *)(((data->field_6).outvec_)->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p)();
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)sink_mutex_);
  return;
}

Assistant:

inline void LogDestination::WaitForSinks(LogMessage::LogMessageData* data) {
  std::shared_lock<SinkMutex> l{sink_mutex_};
  if (sinks_) {
    for (size_t i = sinks_->size(); i-- > 0;) {
      (*sinks_)[i]->WaitTillSent();
    }
  }
  const bool send_to_sink =
      (data->send_method_ == &LogMessage::SendToSink) ||
      (data->send_method_ == &LogMessage::SendToSinkAndLog);
  if (send_to_sink && data->sink_ != nullptr) {
    data->sink_->WaitTillSent();
  }
}